

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O0

vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_> *
vk::getPhysicalDeviceSparseImageFormatProperties
          (vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
           *__return_storage_ptr__,InstanceInterface *vk,VkPhysicalDevice physicalDevice,
          VkFormat format,VkImageType type,VkSampleCountFlagBits samples,VkImageUsageFlags usage,
          VkImageTiling tiling)

{
  VkSampleCountFlagBits VVar1;
  deUint32 dVar2;
  VkSampleCountFlagBits VVar3;
  VkPhysicalDevice pVVar4;
  VkPhysicalDevice pVVar5;
  reference pvVar6;
  ulong uVar7;
  size_type sVar8;
  TestError *this;
  uint local_38;
  VkSampleCountFlagBits local_34;
  deUint32 numProp;
  VkSampleCountFlagBits samples_local;
  VkImageType type_local;
  VkFormat format_local;
  VkPhysicalDevice physicalDevice_local;
  InstanceInterface *vk_local;
  vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
  *properties;
  
  local_38 = 0;
  local_34 = samples;
  numProp = type;
  samples_local = format;
  _type_local = physicalDevice;
  physicalDevice_local = (VkPhysicalDevice)vk;
  vk_local = (InstanceInterface *)__return_storage_ptr__;
  std::vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
  ::vector(__return_storage_ptr__);
  (**(code **)(*(long *)physicalDevice_local + 0x60))
            (physicalDevice_local,_type_local,samples_local,numProp,local_34,usage,tiling,&local_38,
             0);
  if (local_38 != 0) {
    std::
    vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>::
    resize(__return_storage_ptr__,(ulong)local_38);
    pVVar5 = physicalDevice_local;
    pVVar4 = _type_local;
    VVar3 = samples_local;
    dVar2 = numProp;
    VVar1 = local_34;
    pvVar6 = std::
             vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
             ::operator[](__return_storage_ptr__,0);
    (**(code **)(*(long *)pVVar5 + 0x60))
              (pVVar5,pVVar4,VVar3,dVar2,VVar1,usage,tiling,&local_38,pvVar6);
    uVar7 = (ulong)local_38;
    sVar8 = std::
            vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
            ::size(__return_storage_ptr__);
    if (uVar7 != sVar8) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Returned sparse image properties count changes between queries",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkQueryUtil.cpp"
                 ,0x85);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkSparseImageFormatProperties> getPhysicalDeviceSparseImageFormatProperties(const InstanceInterface& vk, VkPhysicalDevice physicalDevice, VkFormat format, VkImageType type, VkSampleCountFlagBits samples, VkImageUsageFlags usage, VkImageTiling tiling)
{
	deUint32								numProp = 0;
	vector<VkSparseImageFormatProperties>	properties;

	vk.getPhysicalDeviceSparseImageFormatProperties(physicalDevice, format, type, samples, usage, tiling, &numProp, DE_NULL);

	if (numProp > 0)
	{
		properties.resize(numProp);
		vk.getPhysicalDeviceSparseImageFormatProperties(physicalDevice, format, type, samples, usage, tiling, &numProp, &properties[0]);

		if ((size_t)numProp != properties.size())
			TCU_FAIL("Returned sparse image properties count changes between queries");
	}

	return properties;
}